

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::Value::Value(Value *this,
                   shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>_>
                   *callable)

{
  long in_RDI;
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *this_00;
  shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>_>
  *in_stack_ffffffffffffffc8;
  
  std::enable_shared_from_this<minja::Value>::enable_shared_from_this
            ((enable_shared_from_this<minja::Value> *)0x21177d);
  this_00 = (basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)(in_RDI + 0x10);
  std::shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>_>::shared_ptr
            ((shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>_> *)0x211790);
  std::
  make_shared<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,minja::Value,std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::allocator<std::pair<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const,minja::Value>>>>
            ();
  std::
  shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>_>
  ::shared_ptr((shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>_>
                *)this_00,in_stack_ffffffffffffffc8);
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json(this_00,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

Value(const std::shared_ptr<CallableType> & callable) : object_(std::make_shared<ObjectType>()), callable_(callable) {}